

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O1

int uv_interface_addresses(uv_interface_address_t **addresses,int *count)

{
  char cVar1;
  short *psVar2;
  char *__s;
  char *__s1;
  long lVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  undefined8 *puVar10;
  uv_interface_address_t *puVar11;
  char *pcVar12;
  size_t __n;
  undefined4 uVar13;
  in_addr_t iVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  ifaddrs *addrs;
  undefined8 *local_48;
  uv_interface_address_t **local_40;
  int *local_38;
  
  *count = 0;
  *addresses = (uv_interface_address_t *)0x0;
  iVar7 = getifaddrs(&local_48);
  puVar10 = local_48;
  if (iVar7 == 0) {
    for (; puVar10 != (undefined8 *)0x0; puVar10 = (undefined8 *)*puVar10) {
      if ((((~*(uint *)(puVar10 + 2) & 0x41) == 0) && ((short *)puVar10[3] != (short *)0x0)) &&
         (*(short *)puVar10[3] != 0x11)) {
        *count = *count + 1;
      }
    }
    piVar9 = local_38;
    if ((long)*count != 0) {
      puVar11 = (uv_interface_address_t *)uv__calloc((long)*count,0x60);
      *addresses = puVar11;
      puVar10 = local_48;
      if (puVar11 == (uv_interface_address_t *)0x0) {
        freeifaddrs(local_48);
        return -0xc;
      }
      for (; local_40 = addresses, piVar6 = count, piVar9 = local_38, puVar5 = local_48,
          puVar10 != (undefined8 *)0x0; puVar10 = (undefined8 *)*puVar10) {
        if ((((~*(uint *)(puVar10 + 2) & 0x41) == 0) && ((short *)puVar10[3] != (short *)0x0)) &&
           (*(short *)puVar10[3] != 0x11)) {
          pcVar12 = uv__strdup((char *)puVar10[1]);
          puVar11->name = pcVar12;
          psVar2 = (short *)puVar10[3];
          if (*psVar2 == 10) {
            uVar13 = *(undefined4 *)psVar2;
            iVar14 = *(in_addr_t *)(psVar2 + 2);
            uVar15 = *(undefined4 *)(psVar2 + 4);
            uVar16 = *(undefined4 *)(psVar2 + 6);
            uVar4 = *(undefined8 *)(psVar2 + 10);
            *(undefined8 *)((long)&puVar11->address + 0xc) = *(undefined8 *)(psVar2 + 6);
            *(undefined8 *)((long)&puVar11->address + 0x14) = uVar4;
          }
          else {
            uVar13 = *(undefined4 *)psVar2;
            iVar14 = *(in_addr_t *)(psVar2 + 2);
            uVar15 = *(undefined4 *)(psVar2 + 4);
            uVar16 = *(undefined4 *)(psVar2 + 6);
          }
          *(undefined4 *)&puVar11->address = uVar13;
          (puVar11->address).address4.sin_addr.s_addr = iVar14;
          *(undefined4 *)((long)&puVar11->address + 8) = uVar15;
          *(undefined4 *)((long)&puVar11->address + 0xc) = uVar16;
          psVar2 = (short *)puVar10[4];
          if (*psVar2 == 10) {
            uVar13 = *(undefined4 *)psVar2;
            iVar14 = *(in_addr_t *)(psVar2 + 2);
            uVar15 = *(undefined4 *)(psVar2 + 4);
            uVar16 = *(undefined4 *)(psVar2 + 6);
            uVar4 = *(undefined8 *)(psVar2 + 10);
            *(undefined8 *)((long)&puVar11->netmask + 0xc) = *(undefined8 *)(psVar2 + 6);
            *(undefined8 *)((long)&puVar11->netmask + 0x14) = uVar4;
          }
          else {
            uVar13 = *(undefined4 *)psVar2;
            iVar14 = *(in_addr_t *)(psVar2 + 2);
            uVar15 = *(undefined4 *)(psVar2 + 4);
            uVar16 = *(undefined4 *)(psVar2 + 6);
          }
          *(undefined4 *)&puVar11->netmask = uVar13;
          (puVar11->netmask).netmask4.sin_addr.s_addr = iVar14;
          *(undefined4 *)((long)&puVar11->netmask + 8) = uVar15;
          *(undefined4 *)((long)&puVar11->netmask + 0xc) = uVar16;
          if ((((*(byte *)(puVar10 + 2) & 2) != 0) &&
              (psVar2 = (short *)puVar10[5], psVar2 != (short *)0x0)) && (*psVar2 == 2)) {
            uVar4 = *(undefined8 *)(psVar2 + 4);
            *(undefined8 *)&puVar11->broadcast = *(undefined8 *)psVar2;
            *(undefined8 *)((long)&puVar11->broadcast + 8) = uVar4;
          }
          puVar11->is_internal = *(uint *)(puVar10 + 2) >> 3 & 1;
          puVar11 = puVar11 + 1;
        }
      }
      for (; local_38 = piVar6, puVar5 != (undefined8 *)0x0; puVar5 = (undefined8 *)*puVar5) {
        if (((((~*(uint *)(puVar5 + 2) & 0x41) == 0) && ((short *)puVar5[3] != (short *)0x0)) &&
            (*(short *)puVar5[3] == 0x11)) && (0 < *count)) {
          pcVar12 = (*local_40)->phys_addr;
          iVar7 = 0;
          do {
            __s = (char *)puVar5[1];
            __n = strlen(__s);
            __s1 = ((uv_interface_address_t *)(pcVar12 + -8))->name;
            iVar8 = strncmp(__s1,__s,__n);
            if ((iVar8 == 0) && ((cVar1 = __s1[__n], cVar1 == ':' || (cVar1 == '\0')))) {
              lVar3 = puVar5[3];
              *(undefined2 *)(pcVar12 + 4) = *(undefined2 *)(lVar3 + 0x10);
              *(undefined4 *)pcVar12 = *(undefined4 *)(lVar3 + 0xc);
            }
            iVar7 = iVar7 + 1;
            pcVar12 = pcVar12 + 0x60;
            count = local_38;
          } while (iVar7 < *local_38);
        }
        piVar6 = local_38;
        piVar9 = local_38;
      }
    }
    local_38 = piVar9;
    freeifaddrs(local_48);
    iVar7 = 0;
  }
  else {
    piVar9 = __errno_location();
    iVar7 = -*piVar9;
  }
  return iVar7;
}

Assistant:

int uv_interface_addresses(uv_interface_address_t** addresses, int* count) {
  struct ifaddrs *addrs, *ent;
  uv_interface_address_t* address;
  int i;
  struct sockaddr_ll *sll;

  *count = 0;
  *addresses = NULL;

  if (getifaddrs(&addrs))
    return UV__ERR(errno);

  /* Count the number of interfaces */
  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFADDR))
      continue;

    (*count)++;
  }

  if (*count == 0) {
    freeifaddrs(addrs);
    return 0;
  }

  /* Make sure the memory is initiallized to zero using calloc() */
  *addresses = uv__calloc(*count, sizeof(**addresses));
  if (!(*addresses)) {
    freeifaddrs(addrs);
    return UV_ENOMEM;
  }

  address = *addresses;

  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFADDR))
      continue;

    address->name = uv__strdup(ent->ifa_name);

    if (ent->ifa_addr->sa_family == AF_INET6) {
      address->address.address6 = *((struct sockaddr_in6*) ent->ifa_addr);
    } else {
      address->address.address4 = *((struct sockaddr_in*) ent->ifa_addr);
    }

    if (ent->ifa_netmask->sa_family == AF_INET6) {
      address->netmask.netmask6 = *((struct sockaddr_in6*) ent->ifa_netmask);
    } else {
      address->netmask.netmask4 = *((struct sockaddr_in*) ent->ifa_netmask);
    }

    if (ent->ifa_flags & IFF_BROADCAST && ent->ifa_broadaddr != NULL) {
      if (ent->ifa_broadaddr->sa_family == AF_INET)
        address->broadcast.broadcast4 = *((struct sockaddr_in*) ent->ifa_broadaddr);
    }

    address->is_internal = !!(ent->ifa_flags & IFF_LOOPBACK);

    address++;
  }

  /* Fill in physical addresses for each interface */
  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFPHYS))
      continue;

    address = *addresses;

    for (i = 0; i < (*count); i++) {
      size_t namelen = strlen(ent->ifa_name);
      /* Alias interface share the same physical address */
      if (strncmp(address->name, ent->ifa_name, namelen) == 0 &&
          (address->name[namelen] == 0 || address->name[namelen] == ':')) {
        sll = (struct sockaddr_ll*)ent->ifa_addr;
        memcpy(address->phys_addr, sll->sll_addr, sizeof(address->phys_addr));
      }
      address++;
    }
  }

  freeifaddrs(addrs);

  return 0;
}